

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void declare_types(void)

{
  int iVar1;
  union_tag *puVar2;
  ushort **ppuVar3;
  bucket *pbVar4;
  union_tag *puVar5;
  char **ppcVar6;
  uint n;
  long lVar7;
  uint uVar8;
  undefined8 auStack_e0 [22];
  
  auStack_e0[0] = 0x11426f;
  iVar1 = nextc();
  if (iVar1 == 0x3c) {
    auStack_e0[0] = 0x11427e;
    puVar2 = get_tag(1);
    auStack_e0[0] = 0x114286;
    iVar1 = nextc();
  }
  else {
    puVar2 = (union_tag *)0x0;
  }
  if (iVar1 == -1) {
    auStack_e0[0] = 0x114294;
    unexpected_EOF();
  }
LAB_0011429e:
  auStack_e0[0] = 0x1142a3;
  iVar1 = nextc();
  auStack_e0[0] = 0x1142ab;
  ppuVar3 = __ctype_b_loc();
  if (((*ppuVar3)[iVar1] >> 10 & 1) == 0) {
    uVar8 = iVar1 - 0x22;
    if (0x3d < uVar8) {
      return;
    }
    if ((0x2000000000001004U >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto LAB_001142d3;
    if ((0x21UL >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
      return;
    }
    auStack_e0[0] = 0x1143ef;
    pbVar4 = get_literal();
    pbVar4->args = 0;
  }
  else {
LAB_001142d3:
    auStack_e0[0] = 0x1142d8;
    pbVar4 = get_name();
    auStack_e0[0] = 0x1142e0;
    iVar1 = nextc();
    if (iVar1 == 0x28) {
      if (-1 < pbVar4->args) {
        auStack_e0[0] = 0x1142f9;
        retyped_warning(pbVar4->name);
      }
      cptr = cptr + 1;
      lVar7 = 1;
      n = 8;
      uVar8 = 0;
      do {
        auStack_e0[0] = 0x114313;
        iVar1 = nextc();
        if (iVar1 != 0x3c) {
          if (iVar1 == -1) {
            auStack_e0[0] = 0x114322;
            unexpected_EOF();
          }
          auStack_e0[0] = 0x11433f;
          syntax_error(input_file->lineno,line,cptr);
        }
        auStack_e0[0] = 0x114349;
        puVar5 = get_tag(1);
        auStack_e0[lVar7] = puVar5->name;
        auStack_e0[0] = 0x114357;
        iVar1 = nextc();
        if (iVar1 == -1) {
          auStack_e0[0] = 0x114368;
          unexpected_EOF();
        }
        else if (iVar1 == 0x29) goto LAB_0011437d;
        lVar7 = lVar7 + 1;
        n = n + 8;
        uVar8 = uVar8 + 1;
      } while( true );
    }
    pbVar4->args = 0;
  }
  goto LAB_001143f9;
LAB_0011437d:
  cptr = cptr + 1;
  pbVar4->args = (Yshort)lVar7;
  auStack_e0[0] = 0x11438f;
  ppcVar6 = (char **)allocate(n);
  pbVar4->argnames = ppcVar6;
  if (ppcVar6 == (char **)0x0) {
    auStack_e0[0] = 0x11439d;
    no_space();
  }
  auStack_e0[0] = 0x1143a4;
  ppcVar6 = (char **)allocate(n);
  pbVar4->argtags = ppcVar6;
  if (ppcVar6 == (char **)0x0) {
    auStack_e0[0] = 0x1143b2;
    no_space();
  }
  do {
    pbVar4->argtags[uVar8] = (char *)auStack_e0[(ulong)uVar8 + 1];
    pbVar4->argnames[uVar8] = (char *)0x0;
    iVar1 = uVar8 + 1;
    uVar8 = uVar8 - 1;
  } while (1 < iVar1);
LAB_001143f9:
  if (puVar2 != (union_tag *)0x0) {
    if (puVar2 != pbVar4->tag && pbVar4->tag != (union_tag *)0x0) {
      auStack_e0[0] = 0x11441f;
      retyped_warning(pbVar4->name);
    }
    pbVar4->tag = puVar2;
  }
  goto LAB_0011429e;
}

Assistant:

void declare_types()
{
    register int c;
    register bucket *bp=0;
    union_tag *tag=0;

    c = nextc();
    if (c == '<') {
	tag = get_tag(1);
	c = nextc(); }
    if (c == EOF) unexpected_EOF();

    for (;;) {
	c = nextc();
	if (isalpha(c) || c == '_' || c == '.' || c == '$') {
	    bp = get_name();
	    if (nextc() == '(')
		declare_argtypes(bp);
	    else
		bp->args = 0; }
	else if (c == '\'' || c == '"') {
	    bp = get_literal();
	    bp->args = 0; }
	else
	    return;

	if (tag) {
	    if (bp->tag && tag != bp->tag)
		retyped_warning(bp->name);
	    bp->tag = tag; } }
}